

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_Int ft_mem_strcpyn(char *dst,char *src,FT_ULong size)

{
  bool bVar1;
  ulong local_20;
  FT_ULong size_local;
  char *src_local;
  char *dst_local;
  
  local_20 = size;
  size_local = (FT_ULong)src;
  src_local = dst;
  while( true ) {
    bVar1 = false;
    if (1 < local_20) {
      bVar1 = *(char *)size_local != '\0';
    }
    if (!bVar1) break;
    *src_local = *(char *)size_local;
    local_20 = local_20 - 1;
    size_local = size_local + 1;
    src_local = src_local + 1;
  }
  *src_local = '\0';
  return (FT_Int)(*(char *)size_local != '\0');
}

Assistant:

FT_BASE_DEF( FT_Int )
  ft_mem_strcpyn( char*        dst,
                  const char*  src,
                  FT_ULong     size )
  {
    while ( size > 1 && *src != 0 )
    {
      *dst++ = *src++;
      size--;
    }

    *dst = 0;  /* always zero-terminate */

    return *src != 0;
  }